

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestLaunchReporter.cxx
# Opt level: O2

void __thiscall
cmCTestLaunchReporter::DumpFileToXML
          (cmCTestLaunchReporter *this,cmXMLElement *e3,char *tag,string *fname)

{
  bool bVar1;
  cmCTestLaunchReporter *this_00;
  cmXMLElement e4;
  char *sep;
  vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_> *local_2e0;
  string line;
  cmAlphaNum local_2b8;
  cmAlphaNum local_288;
  string local_258;
  ifstream fin;
  
  std::ifstream::ifstream(&fin,(fname->_M_dataplus)._M_p,_S_in|_S_bin);
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  sep = "";
  cmXMLElement::cmXMLElement(&e4,e3,tag);
  local_2e0 = &this->RegexWarning;
  do {
    do {
      bVar1 = cmsys::SystemTools::GetLineFromStream
                        ((istream *)&fin,&line,(bool *)0x0,0xffffffffffffffff);
      if (!bVar1) {
        cmXMLElement::~cmXMLElement(&e4);
        std::__cxx11::string::~string((string *)&line);
        std::ifstream::~ifstream(&fin);
        return;
      }
      this_00 = this;
      bVar1 = MatchesFilterPrefix(this,&line);
    } while (bVar1);
    bVar1 = Match(this_00,&line,&this->RegexWarningSuppress);
    if (bVar1) {
      local_288.View_._M_len = 0x1c;
      local_288.View_._M_str = "[CTest: warning suppressed] ";
      local_2b8.View_._M_len = line._M_string_length;
      local_2b8.View_._M_str = line._M_dataplus._M_p;
      cmStrCat<>(&local_258,&local_288,&local_2b8);
LAB_00189d9c:
      std::__cxx11::string::operator=((string *)&line,(string *)&local_258);
      std::__cxx11::string::~string((string *)&local_258);
    }
    else {
      bVar1 = Match(this_00,&line,local_2e0);
      if (bVar1) {
        local_288.View_._M_len = 0x19;
        local_288.View_._M_str = "[CTest: warning matched] ";
        local_2b8.View_._M_len = line._M_string_length;
        local_2b8.View_._M_str = line._M_dataplus._M_p;
        cmStrCat<>(&local_258,&local_288,&local_2b8);
        goto LAB_00189d9c;
      }
    }
    cmXMLWriter::Content<char_const*>(e4.xmlwr,&sep);
    cmXMLWriter::Content<std::__cxx11::string>(e4.xmlwr,&line);
    sep = "\n";
  } while( true );
}

Assistant:

void cmCTestLaunchReporter::DumpFileToXML(cmXMLElement& e3, const char* tag,
                                          std::string const& fname)
{
  cmsys::ifstream fin(fname.c_str(), std::ios::in | std::ios::binary);

  std::string line;
  const char* sep = "";

  cmXMLElement e4(e3, tag);
  while (cmSystemTools::GetLineFromStream(fin, line)) {
    if (this->MatchesFilterPrefix(line)) {
      continue;
    }
    if (this->Match(line, this->RegexWarningSuppress)) {
      line = cmStrCat("[CTest: warning suppressed] ", line);
    } else if (this->Match(line, this->RegexWarning)) {
      line = cmStrCat("[CTest: warning matched] ", line);
    }
    e4.Content(sep);
    e4.Content(line);
    sep = "\n";
  }
}